

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O2

int event_priority_set(event *ev,int pri)

{
  int iVar1;
  
  event_debug_assert_is_setup_(ev);
  iVar1 = -1;
  if (((-1 < pri) && (((ev->ev_evcallback).evcb_flags & 8U) == 0)) &&
     (pri < ev->ev_base->nactivequeues)) {
    (ev->ev_evcallback).evcb_pri = (uint8_t)pri;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int
event_priority_set(struct event *ev, int pri)
{
	event_debug_assert_is_setup_(ev);

	if (ev->ev_flags & EVLIST_ACTIVE)
		return (-1);
	if (pri < 0 || pri >= ev->ev_base->nactivequeues)
		return (-1);

	ev->ev_pri = pri;

	return (0);
}